

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadTypeSection(BinaryReader *this,Offset section_size)

{
  Enum EVar1;
  Type type_00;
  Type type_01;
  Enum EVar2;
  bool bVar3;
  int iVar4;
  Result RVar5;
  pointer pTVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  char *format;
  pointer pTVar10;
  uint uVar11;
  pointer pTVar12;
  long lVar13;
  pointer __new_size;
  ulong __new_size_00;
  uint8_t type;
  Type form;
  Index num_results;
  Index num_params;
  Index num_signatures;
  TypeMut local_78;
  Type local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  TypeVector *local_50;
  TypeVector *local_48;
  TypeMutVector *local_40;
  ulong local_38;
  
  iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[9])();
  if (iVar4 == 0) {
    RVar5 = ReadCount(this,&local_54,"type count");
    if (RVar5.enum_ != Error) {
      iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[10])(this->delegate_,(ulong)local_54);
      if (iVar4 == 0) {
        if (local_54 != 0) {
          local_40 = &this->fields_;
          local_48 = &this->param_types_;
          local_50 = &this->result_types_;
          uVar7 = 0;
          uVar8 = local_54;
          do {
            if ((this->options_->features).gc_enabled_ == true) {
              RVar5 = ReadType(this,&local_68,"type form");
              if (RVar5.enum_ == Error) {
                return (Result)Error;
              }
              if (local_68.enum_ == Array) {
                if ((this->options_->features).gc_enabled_ == false) {
                  pcVar9 = "invalid type form: array not allowed";
                  goto LAB_0013e514;
                }
                RVar5 = ReadField(this,&local_78);
                if (RVar5.enum_ == Error) {
                  return (Result)Error;
                }
                iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd])
                                  (this->delegate_,uVar7,
                                   CONCAT44(local_78.type.type_index_,local_78.type.enum_),
                                   (ulong)(uint)local_78._8_4_);
                if (iVar4 != 0) {
                  pcVar9 = "OnArrayType callback failed";
                  goto LAB_0013e514;
                }
              }
              else {
                if (local_68.enum_ != Struct) {
                  if (local_68.enum_ != Func) {
                    pcVar9 = "";
                    if (local_68.enum_ < Any) {
                      pcVar9 = "-";
                    }
                    EVar1 = -local_68.enum_;
                    if (Any < local_68.enum_) {
                      EVar1 = local_68.enum_;
                    }
                    uVar7 = (ulong)(uint)EVar1;
                    format = "unexpected type form (got %s%#x)";
LAB_0013e88d:
                    PrintError(this,format,pcVar9,uVar7);
                    return (Result)Error;
                  }
                  goto LAB_0013e5d2;
                }
                if ((this->options_->features).gc_enabled_ == false) {
                  pcVar9 = "invalid type form: struct not allowed";
                  goto LAB_0013e514;
                }
                RVar5 = ReadCount(this,(Index *)&local_78,"field count");
                if (RVar5.enum_ == Error) {
                  return (Result)Error;
                }
                __new_size_00 = (ulong)(uint)local_78.type.enum_;
                std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::resize
                          (local_40,__new_size_00);
                if (__new_size_00 != 0) {
                  lVar13 = 0;
                  do {
                    RVar5 = ReadField(this,(TypeMut *)
                                           ((long)&(((this->fields_).
                                                                                                          
                                                  super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type).
                                                  enum_ + lVar13));
                    if (RVar5.enum_ == Error) {
                      return (Result)Error;
                    }
                    lVar13 = lVar13 + 0xc;
                  } while (__new_size_00 * 0xc != lVar13);
                }
                iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc])
                                  (this->delegate_,uVar7,
                                   (ulong)(uint)((int)((ulong)((long)(this->fields_).
                                                                                                                                          
                                                  super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->fields_).
                                                                                                                
                                                  super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                                -0x55555555));
                if (iVar4 != 0) {
                  pcVar9 = "OnStructType callback failed";
                  goto LAB_0013e514;
                }
              }
            }
            else {
              RVar5 = ReadU8(this,(uint8_t *)&local_78,"type form");
              if (RVar5.enum_ == Error) {
                return (Result)Error;
              }
              if ((undefined1)local_78.type.enum_ != 0x60) {
                PrintError(this,"unexpected type form (got %#x)");
                return (Result)Error;
              }
              local_68.enum_ = Func;
              local_68.type_index_ = 0;
LAB_0013e5d2:
              RVar5 = ReadCount(this,&local_58,"function param count");
              if (RVar5.enum_ == Error) {
                return (Result)Error;
              }
              __new_size = (pointer)(ulong)local_58;
              local_38 = uVar7;
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                        (local_48,(size_type)__new_size);
              if (__new_size != (pointer)0x0) {
                pTVar12 = (pointer)0x0;
                do {
                  RVar5 = ReadType(this,&local_78.type,"function param type");
                  EVar1 = local_78.type.enum_;
                  if (RVar5.enum_ == Error) {
                    return (Result)Error;
                  }
                  type_00.type_index_ = local_78.type.type_index_;
                  type_00.enum_ = local_78.type.enum_;
                  bVar3 = IsConcreteType((BinaryReader *)this->options_,type_00);
                  if (!bVar3) {
                    pcVar9 = "";
                    if (EVar1 < Any) {
                      pcVar9 = "-";
                    }
                    EVar2 = -EVar1;
                    if (Any < EVar1) {
                      EVar2 = EVar1;
                    }
                    uVar7 = (ulong)(uint)EVar2;
                    format = "expected valid param type (got %s%#x)";
                    goto LAB_0013e88d;
                  }
                  (local_48->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)pTVar12] = type_00;
                  pTVar12 = (pointer)((long)&pTVar12->enum_ + 1);
                } while (__new_size != pTVar12);
              }
              RVar5 = ReadCount(this,&local_5c,"function result count");
              if (RVar5.enum_ == Error) {
                return (Result)Error;
              }
              pTVar12 = (pointer)(ulong)local_5c;
              local_60 = uVar8;
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                        (local_50,(size_type)pTVar12);
              if (pTVar12 != (pointer)0x0) {
                pTVar6 = (pointer)0x0;
                do {
                  RVar5 = ReadType(this,&local_78.type,"function result type");
                  EVar1 = local_78.type.enum_;
                  if (RVar5.enum_ == Error) {
                    return (Result)Error;
                  }
                  type_01.type_index_ = local_78.type.type_index_;
                  type_01.enum_ = local_78.type.enum_;
                  bVar3 = IsConcreteType((BinaryReader *)this->options_,type_01);
                  if (!bVar3) {
                    pcVar9 = "";
                    if (EVar1 < Any) {
                      pcVar9 = "-";
                    }
                    EVar2 = -EVar1;
                    if (Any < EVar1) {
                      EVar2 = EVar1;
                    }
                    uVar7 = (ulong)(uint)EVar2;
                    format = "expected valid result type (got %s%#x)";
                    goto LAB_0013e88d;
                  }
                  (local_50->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)pTVar6] = type_01;
                  pTVar6 = (pointer)((long)&pTVar6->enum_ + 1);
                } while (pTVar12 != pTVar6);
              }
              uVar7 = local_38;
              pTVar6 = __new_size;
              if (__new_size != (pointer)0x0) {
                pTVar6 = (this->param_types_).
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              pTVar10 = pTVar12;
              if (pTVar12 != (pointer)0x0) {
                pTVar10 = (this->result_types_).
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb])
                                (this->delegate_,local_38 & 0xffffffff,__new_size,pTVar6,pTVar12,
                                 pTVar10);
              uVar8 = local_60;
              if (iVar4 != 0) {
                pcVar9 = "OnFuncType callback failed";
                goto LAB_0013e514;
              }
            }
            uVar11 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar11;
          } while (uVar11 != uVar8);
        }
        iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xe])();
        if (iVar4 == 0) {
          return (Result)Ok;
        }
        pcVar9 = "EndTypeSection callback failed";
      }
      else {
        pcVar9 = "OnTypeCount callback failed";
      }
LAB_0013e514:
      PrintError(this,pcVar9);
    }
  }
  else {
    PrintError(this,"BeginTypeSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTypeSection(Offset section_size) {
  CALLBACK(BeginTypeSection, section_size);
  Index num_signatures;
  CHECK_RESULT(ReadCount(&num_signatures, "type count"));
  CALLBACK(OnTypeCount, num_signatures);

  for (Index i = 0; i < num_signatures; ++i) {
    Type form;
    if (options_.features.gc_enabled()) {
      CHECK_RESULT(ReadType(&form, "type form"));
    } else {
      uint8_t type;
      CHECK_RESULT(ReadU8(&type, "type form"));
      ERROR_UNLESS(type == 0x60, "unexpected type form (got %#x)", type);
      form = Type::Func;
    }

    switch (form) {
      case Type::Func: {
        Index num_params;
        CHECK_RESULT(ReadCount(&num_params, "function param count"));

        param_types_.resize(num_params);

        for (Index j = 0; j < num_params; ++j) {
          Type param_type;
          CHECK_RESULT(ReadType(&param_type, "function param type"));
          ERROR_UNLESS(IsConcreteType(param_type),
                       "expected valid param type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(param_type));
          param_types_[j] = param_type;
        }

        Index num_results;
        CHECK_RESULT(ReadCount(&num_results, "function result count"));

        result_types_.resize(num_results);

        for (Index j = 0; j < num_results; ++j) {
          Type result_type;
          CHECK_RESULT(ReadType(&result_type, "function result type"));
          ERROR_UNLESS(IsConcreteType(result_type),
                       "expected valid result type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(result_type));
          result_types_[j] = result_type;
        }

        Type* param_types = num_params ? param_types_.data() : nullptr;
        Type* result_types = num_results ? result_types_.data() : nullptr;

        CALLBACK(OnFuncType, i, num_params, param_types, num_results,
                 result_types);
        break;
      }

      case Type::Struct: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: struct not allowed");
        Index num_fields;
        CHECK_RESULT(ReadCount(&num_fields, "field count"));

        fields_.resize(num_fields);
        for (Index j = 0; j < num_fields; ++j) {
          CHECK_RESULT(ReadField(&fields_[j]));
        }

        CALLBACK(OnStructType, i, fields_.size(), fields_.data());
        break;
      }

      case Type::Array: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: array not allowed");

        TypeMut field;
        CHECK_RESULT(ReadField(&field));
        CALLBACK(OnArrayType, i, field);
        break;
      };

      default:
        PrintError("unexpected type form (got " PRItypecode ")",
                   WABT_PRINTF_TYPE_CODE(form));
        return Result::Error;
    }
  }
  CALLBACK0(EndTypeSection);
  return Result::Ok;
}